

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O2

vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *
dgrminer::find_backward_edge_candidates
          (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
           *__return_storage_ptr__,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *adj_list,
          vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
          *adj_more_info,int src,int dst,vector<int,_std::allocator<int>_> *real_ids_src,
          vector<int,_std::allocator<int>_> *real_ids_dst,
          vector<int,_std::allocator<int>_> *real_ids_dst_ind)

{
  pointer pvVar1;
  long lVar2;
  bool bVar3;
  pointer piVar4;
  size_type sVar5;
  pointer pvVar6;
  pointer piVar7;
  long lVar8;
  long lVar9;
  size_t i;
  ulong uVar10;
  uint local_c4;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_c0;
  int local_b4;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_b0;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  *local_a8;
  long local_a0;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
  occupied_edges_from_other_direction;
  set<int,_std::less<int>,_std::allocator<int>_> occupied_from_the_same_direction;
  array<int,_8UL> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  occupied_from_the_same_direction._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &occupied_from_the_same_direction._M_t._M_impl.super__Rb_tree_header._M_header;
  occupied_from_the_same_direction._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  occupied_from_the_same_direction._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  occupied_from_the_same_direction._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar9 = 0;
  uVar10 = 0;
  local_c0 = __return_storage_ptr__;
  local_b0 = adj_list;
  local_a8 = adj_more_info;
  occupied_from_the_same_direction._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       occupied_from_the_same_direction._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    piVar4 = (real_ids_src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (real_ids_src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)piVar7 - (long)piVar4 >> 2) <= uVar10) break;
    if ((*(int *)((long)piVar4 + lVar9) == src) &&
       (*(int *)((long)(real_ids_dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar9) == dst)) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &occupied_from_the_same_direction,
                 (int *)((long)(real_ids_dst_ind->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar9));
    }
    uVar10 = uVar10 + 1;
    lVar9 = lVar9 + 4;
  }
  occupied_edges_from_other_direction.
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  occupied_edges_from_other_direction.
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  occupied_edges_from_other_direction.
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0 = (long)dst * 0x18;
  for (uVar10 = 0; uVar10 < (ulong)((long)piVar7 - (long)piVar4 >> 2); uVar10 = uVar10 + 1) {
    if ((piVar4[uVar10] == dst) &&
       ((real_ids_dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar10] == src)) {
      std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::push_back
                (&occupied_edges_from_other_direction,
                 (value_type *)
                 ((long)(real_ids_dst_ind->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar10] * 0x20 +
                 *(long *)((long)&(((local_a8->
                                    super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  )._M_impl.super__Vector_impl_data + local_a0)));
      piVar4 = (real_ids_src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (real_ids_src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  pvVar1 = (local_b0->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (ulong)((long)*(pointer *)
                          ((long)&pvVar1[src].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data + 8) -
                  *(long *)&pvVar1[src].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data) >> 2;
  local_b4 = dst;
  do {
    local_c4 = (int)uVar10 - 1;
    if ((int)local_c4 < 0) {
      std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
                (&occupied_edges_from_other_direction.
                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&occupied_from_the_same_direction._M_t);
      return local_c0;
    }
    if ((*(int *)(*(long *)&(local_b0->
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[src].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + (ulong)local_c4 * 4) == local_b4) &&
       (sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                          (&occupied_from_the_same_direction,(key_type *)&local_c4), sVar5 == 0)) {
      uVar10 = 0xffffffffffffffff;
      lVar9 = 0;
      do {
        pvVar6 = (local_a8->
                 super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + src;
        lVar8 = (long)(int)local_c4;
        uVar10 = uVar10 + 1;
        if ((ulong)((long)occupied_edges_from_other_direction.
                          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)occupied_edges_from_other_direction.
                          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar10) {
          std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::push_back
                    (local_c0,(value_type *)
                              (lVar8 * 0x20 +
                              *(long *)&(pvVar6->
                                        super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        )._M_impl.super__Vector_impl_data));
          break;
        }
        lVar2 = *(long *)&(pvVar6->
                          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          )._M_impl.super__Vector_impl_data;
        flipAdjacencyInfo((array<int,_8UL> *)
                          ((long)(occupied_edges_from_other_direction.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar9));
        bVar3 = is_adj_info_equal_to((array<int,_8UL> *)(lVar2 + lVar8 * 0x20),&local_50,false);
        lVar9 = lVar9 + 0x20;
      } while (!bVar3);
    }
    uVar10 = (ulong)local_c4;
  } while( true );
}

Assistant:

std::vector<std::array<int, 8>> find_backward_edge_candidates(std::vector<std::vector<int>> &adj_list,
		std::vector<std::vector<std::array<int, 8>>> &adj_more_info, int src, int dst,
		std::vector<int> &real_ids_src, std::vector<int> &real_ids_dst, std::vector<int> &real_ids_dst_ind)
	{
		std::vector<std::array<int, 8>> edge_candidates;

		std::set<int> occupied_from_the_same_direction;
		for (size_t i = 0; i < real_ids_src.size(); i++)
		{
			if (real_ids_src[i] == src && real_ids_dst[i] == dst) {
				occupied_from_the_same_direction.insert(real_ids_dst_ind[i]);
			}
		}
		std::vector<std::array<int, 8>> occupied_edges_from_other_direction;
		for (size_t i = 0; i < real_ids_src.size(); i++)
		{
			if (real_ids_src[i] == dst && real_ids_dst[i] == src) {
				occupied_edges_from_other_direction.push_back(adj_more_info[dst][real_ids_dst_ind[i]]);
			}
		}

		// do it in a reversed order, so we can find dummy first - this property is used in the .enumerate function
		for (int v = adj_list[src].size() - 1; v >= 0; v--)
		{
			//if it is the appropriate edge and it can be taken (if it is not occupied from the same direction):
			if (adj_list[src][v] == dst && occupied_from_the_same_direction.count(v) == 0)
			{
				bool can_be_used = true;
				for (size_t i = 0; i < occupied_edges_from_other_direction.size(); i++)
				{
					if (is_adj_info_equal_to(adj_more_info[src][v], flipAdjacencyInfo(occupied_edges_from_other_direction[i]), false))
					{
						can_be_used = false;
						break;
					}
				}
				if (can_be_used)
				{
					edge_candidates.push_back(adj_more_info[src][v]);
				}
			}
		}
		return edge_candidates;
	}